

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader.cpp
# Opt level: O0

SourceBase * __thiscall
COLLADASaxFWL::SourceArrayLoader::getSourceById(SourceArrayLoader *this,String *sourceId)

{
  SourceBase *this_00;
  bool bVar1;
  String *pSVar2;
  SourceBase **ppSVar3;
  String *in_RDI;
  SourceBase *source;
  size_t i;
  String *str2;
  String *local_20;
  
  local_20 = (String *)0x0;
  while( true ) {
    str2 = local_20;
    pSVar2 = (String *)
             COLLADAFW::ArrayPrimitiveType<COLLADASaxFWL::SourceBase_*>::getCount
                       ((ArrayPrimitiveType<COLLADASaxFWL::SourceBase_*> *)(in_RDI + 1));
    if (pSVar2 <= str2) {
      return (SourceBase *)0x0;
    }
    ppSVar3 = COLLADAFW::ArrayPrimitiveType<COLLADASaxFWL::SourceBase_*>::operator[]
                        ((ArrayPrimitiveType<COLLADASaxFWL::SourceBase_*> *)(in_RDI + 1),
                         (size_t)local_20);
    this_00 = *ppSVar3;
    SourceBase::getId_abi_cxx11_(this_00);
    bVar1 = COLLADABU::Utils::equals(in_RDI,str2);
    if (bVar1) break;
    local_20 = (String *)&local_20->field_0x1;
  }
  return this_00;
}

Assistant:

SourceBase* SourceArrayLoader::getSourceById ( const String& sourceId ) 
    {
        for ( size_t i=0; i<mSourceArray.getCount (); ++i )
        {
            SourceBase* source = mSourceArray [ i ];
            if ( COLLADABU::Utils::equals ( source->getId (), sourceId ) )
                return source;
        }
        return 0;
    }